

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double bpser(double *a,double *b,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *eps_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  bpser::bpser = 0.0;
  if ((*x != 0.0) || (NAN(*x))) {
    bpser::a0 = fifdmin1(*a,*b);
    if (1.0 <= bpser::a0) {
      dVar1 = *a;
      dVar2 = log(*x);
      dVar3 = betaln(a,b);
      bpser::z = dVar1 * dVar2 + -dVar3;
      dVar1 = exp(bpser::z);
      bpser::bpser = dVar1 / *a;
    }
    else {
      bpser::b0 = fifdmax1(*a,*b);
      if (bpser::b0 < 8.0) {
        if (bpser::b0 <= 1.0) {
          bpser::bpser = pow(*x,*a);
          if ((bpser::bpser == 0.0) && (!NAN(bpser::bpser))) {
            return bpser::bpser;
          }
          bpser::apb = *a + *b;
          if (bpser::apb <= 1.0) {
            dVar1 = gam1(&bpser::apb);
            bpser::z = dVar1 + 1.0;
          }
          else {
            bpser::u = (*a + *b) - 1.0;
            dVar1 = gam1(&bpser::u);
            bpser::z = (dVar1 + 1.0) / bpser::apb;
          }
          dVar1 = gam1(a);
          dVar2 = gam1(b);
          bpser::c = ((dVar1 + 1.0) * (dVar2 + 1.0)) / bpser::z;
          bpser::bpser = bpser::c * (*b / bpser::apb) * bpser::bpser;
        }
        else {
          bpser::u = gamln1(&bpser::a0);
          bpser::m = (int)(bpser::b0 - 1.0);
          if (0 < bpser::m) {
            bpser::c = 1.0;
            for (bpser::i = 1; bpser::i <= bpser::m; bpser::i = bpser::i + 1) {
              bpser::b0 = bpser::b0 - 1.0;
              bpser::c = (bpser::b0 / (bpser::a0 + bpser::b0)) * bpser::c;
            }
            dVar1 = log(bpser::c);
            bpser::u = dVar1 + bpser::u;
          }
          dVar1 = *a;
          dVar2 = log(*x);
          bpser::z = dVar1 * dVar2 + -bpser::u;
          bpser::b0 = bpser::b0 - 1.0;
          bpser::apb = bpser::a0 + bpser::b0;
          if (bpser::apb <= 1.0) {
            dVar1 = gam1(&bpser::apb);
            bpser::t = dVar1 + 1.0;
          }
          else {
            bpser::u = (bpser::a0 + bpser::b0) - 1.0;
            dVar1 = gam1(&bpser::u);
            bpser::t = (dVar1 + 1.0) / bpser::apb;
          }
          dVar1 = exp(bpser::z);
          dVar3 = bpser::a0 / *a;
          dVar2 = gam1(&bpser::b0);
          bpser::bpser = (dVar1 * dVar3 * (dVar2 + 1.0)) / bpser::t;
        }
      }
      else {
        dVar1 = gamln1(&bpser::a0);
        dVar2 = algdiv(&bpser::a0,&bpser::b0);
        bpser::u = dVar1 + dVar2;
        dVar1 = *a;
        dVar2 = log(*x);
        bpser::z = dVar1 * dVar2 + -bpser::u;
        dVar1 = bpser::a0 / *a;
        dVar2 = exp(bpser::z);
        bpser::bpser = dVar1 * dVar2;
      }
    }
    if (((bpser::bpser == 0.0) && (!NAN(bpser::bpser))) || (*a <= *eps * 0.1)) {
      a_local = (double *)bpser::bpser;
    }
    else {
      bpser::n = 0.0;
      bpser::sum = 0.0;
      bpser::c = 1.0;
      bpser::tol = *eps / *a;
      do {
        bpser::n = bpser::n + 1.0;
        bpser::c = ((0.5 - *b / bpser::n) + 0.5) * *x * bpser::c;
        bpser::w = bpser::c / (*a + bpser::n);
        bpser::sum = bpser::w + bpser::sum;
      } while (bpser::tol < ABS(bpser::w));
      a_local = (double *)((*a * bpser::sum + 1.0) * bpser::bpser);
    }
  }
  else {
    a_local = (double *)0x0;
  }
  bpser::bpser = (double)a_local;
  return (double)a_local;
}

Assistant:

double bpser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------
     POWER SERIES EXPANSION FOR EVALUATING IX(A,B) WHEN B .LE. 1
     OR B*X .LE. 0.7.  EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static double bpser,a0,apb,b0,c,n,sum,t,tol,u,w,z;
static int i,m;
/*
     ..
     .. Executable Statements ..
*/
    bpser = 0.0e0;
    if(*x == 0.0e0) return bpser;
/*
-----------------------------------------------------------------------
            COMPUTE THE FACTOR X**A/(A*BETA(A,B))
-----------------------------------------------------------------------
*/
    a0 = fifdmin1(*a,*b);
    if(a0 < 1.0e0) goto S10;
    z = *a*log(*x)-betaln(a,b);
    bpser = exp(z)/ *a;
    goto S100;
S10:
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S90;
    if(b0 > 1.0e0) goto S40;
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .LE. 1
*/
    bpser = pow(*x,*a);
    if(bpser == 0.0e0) return bpser;
    apb = *a+*b;
    if(apb > 1.0e0) goto S20;
    z = 1.0e0+gam1(&apb);
    goto S30;
S20:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S30:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    bpser *= (c*(*b/apb));
    goto S100;
S40:
/*
         PROCEDURE FOR A0 .LT. 1 AND 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    m = b0-1.0e0;
    if(m < 1) goto S60;
    c = 1.0e0;
    for(i=1; i<=m; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S60:
    z = *a*log(*x)-u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S70;
    t = 1.0e0+gam1(&apb);
    goto S80;
S70:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S80:
    bpser = exp(z)*(a0/ *a)*(1.0e0+gam1(&b0))/t;
    goto S100;
S90:
/*
            PROCEDURE FOR A0 .LT. 1 AND B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    z = *a*log(*x)-u;
    bpser = a0/ *a*exp(z);
S100:
    if(bpser == 0.0e0 || *a <= 0.1e0**eps) return bpser;
/*
-----------------------------------------------------------------------
                     COMPUTE THE SERIES
-----------------------------------------------------------------------
*/
    sum = n = 0.0e0;
    c = 1.0e0;
    tol = *eps/ *a;
S110:
    n += 1.0e0;
    c *= ((0.5e0+(0.5e0-*b/n))**x);
    w = c/(*a+n);
    sum += w;
    if(fabs(w) > tol) goto S110;
    bpser *= (1.0e0+*a*sum);
    return bpser;
}